

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int invalidateTempStorage(Parse *pParse)

{
  sqlite3 *db_00;
  int iVar1;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (db_00->aDb[1].pBt == (Btree *)0x0) {
LAB_001e100b:
    pParse_local._4_4_ = 0;
  }
  else {
    if (db_00->autoCommit != '\0') {
      iVar1 = sqlite3BtreeIsInReadTrans(db_00->aDb[1].pBt);
      if (iVar1 == 0) {
        sqlite3BtreeClose(db_00->aDb[1].pBt);
        db_00->aDb[1].pBt = (Btree *)0x0;
        sqlite3ResetAllSchemasOfConnection(db_00);
        goto LAB_001e100b;
      }
    }
    sqlite3ErrorMsg(pParse,"temporary storage cannot be changed from within a transaction");
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

static int invalidateTempStorage(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt!=0 ){
    if( !db->autoCommit || sqlite3BtreeIsInReadTrans(db->aDb[1].pBt) ){
      sqlite3ErrorMsg(pParse, "temporary storage cannot be changed "
        "from within a transaction");
      return SQLITE_ERROR;
    }
    sqlite3BtreeClose(db->aDb[1].pBt);
    db->aDb[1].pBt = 0;
    sqlite3ResetAllSchemasOfConnection(db);
  }
  return SQLITE_OK;
}